

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v10::detail::
         do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>
                   (appender out,decimal_fp<float> *f,format_specs<char> *specs,float_specs fspecs,
                   locale_ref loc)

{
  float_specs fVar1;
  byte bVar2;
  int iVar3;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar4;
  appender aVar5;
  undefined8 uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  undefined8 uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  size_t sVar15;
  bool bVar16;
  char decimal_point;
  sign_t sign;
  char zero;
  bool pointy;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_28_8_ad0ecca5 write;
  int num_zeros;
  undefined1 local_d7 [2];
  undefined1 local_d5 [5];
  float_specs local_d0;
  int local_c4;
  float_specs local_c0;
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  float_specs *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  char *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_c0.precision = f->significand;
  uVar12 = 0x1f;
  if ((local_c0.precision | 1U) != 0) {
    for (; (local_c0.precision | 1U) >> uVar12 == 0; uVar12 = uVar12 - 1) {
    }
  }
  uVar9 = (ulong)(uint)local_c0.precision +
          *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar12 * 8);
  local_c4 = (int)(uVar9 >> 0x20);
  local_d5[0] = '0';
  local_d0._4_4_ = fspecs._4_4_;
  local_d7[1] = fspecs._5_1_;
  fVar1 = fspecs;
  if (-1 < (long)uVar9) {
    bVar16 = local_d7[1] != none;
    local_d7[0] = '.';
    uVar12 = (uint)local_d0._4_4_ >> 0x11;
    local_d0 = fspecs;
    if ((uVar12 & 1) != 0) {
      local_d7[0] = decimal_point_impl<char>(loc);
    }
    uVar6 = local_a8._M_allocated_capacity;
    lVar14 = (ulong)bVar16 + (uVar9 >> 0x20);
    uVar12 = f->exponent;
    local_c0._4_4_ = local_c4 + uVar12;
    iVar13 = local_d0.precision;
    if (local_d0._4_1_ == '\x01') {
LAB_001f12b0:
      iVar8 = uVar12 + local_c4 + -1;
      if (((uint)local_d0._4_4_ >> 0x13 & 1) == 0) {
        uVar9 = 0;
        if (local_c4 == 1) {
          local_d7[0] = '\0';
        }
      }
      else {
        uVar9 = 0;
        if (0 < iVar13 - local_c4) {
          uVar9 = (ulong)(uint)(iVar13 - local_c4);
        }
        lVar14 = lVar14 + uVar9;
      }
      local_b8[0] = local_d7[1];
      local_b8._4_4_ = local_c0.precision;
      local_b8[0xc] = local_d7[0];
      local_b8._8_4_ = local_c4;
      local_a8._M_allocated_capacity._0_5_ = CONCAT14('0',(int)uVar9);
      local_a8._M_allocated_capacity._6_2_ = SUB82(uVar6,6);
      local_a8._M_allocated_capacity =
           CONCAT26(local_a8._M_allocated_capacity._6_2_,
                    CONCAT15((((uint)local_d0._4_4_ >> 0x10 & 1) == 0) << 5,
                             local_a8._M_allocated_capacity._0_5_)) | 0x450000000000;
      local_a8._8_4_ = iVar8;
      if (0 < specs->width) {
        if ((int)local_c0._4_4_ < 1) {
          iVar8 = 1 - local_c0._4_4_;
        }
        lVar10 = 2;
        if (99 < iVar8) {
          lVar10 = (ulong)(999 < iVar8) + 3;
        }
        sVar15 = lVar14 + lVar10 + (3 - (ulong)(local_d7[0] == '\0'));
        aVar5 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_&>
                          (out,specs,sVar15,sVar15,(anon_class_28_8_ad0ecca5 *)local_b8);
        return (appender)
               aVar5.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container
        ;
      }
      aVar5 = do_write_float<fmt::v10::appender,_fmt::v10::detail::dragonbox::decimal_fp<float>,_char,_fmt::v10::detail::digit_grouping<char>_>
              ::anon_class_28_8_ad0ecca5::operator()
                        ((anon_class_28_8_ad0ecca5 *)local_b8,
                         (iterator)
                         out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
      return (appender)
             aVar5.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
    }
    if (((ulong)local_d0 & 0xff00000000) == 0) {
      iVar8 = 0x10;
      if (0 < iVar13) {
        iVar8 = iVar13;
      }
      if (((int)local_c0._4_4_ < -3) || (iVar8 < (int)local_c0._4_4_)) goto LAB_001f12b0;
    }
    if ((int)uVar12 < 0) {
      if ((int)local_c0._4_4_ < 1) {
        iVar3 = -local_c0._4_4_;
        iVar8 = iVar3;
        if (SBORROW4(iVar13,iVar3) != iVar13 + local_c0._4_4_ < 0) {
          iVar8 = iVar13;
        }
        if (iVar13 < 0) {
          iVar8 = iVar3;
        }
        if (local_c4 != 0) {
          iVar8 = iVar3;
        }
        local_70._M_allocated_capacity._0_4_ = iVar8;
        bVar2 = 1;
        if (local_c4 == 0 && iVar8 == 0) {
          bVar2 = (local_d0._6_1_ & 8) >> 3;
        }
        local_d5[1] = bVar2;
        fVar1 = local_d0;
        if (-1 < iVar8) {
          sVar15 = lVar14 + (ulong)((uint)bVar2 + iVar8 + 1);
          local_b8._0_8_ = local_d7 + 1;
          local_b8._8_8_ = local_d7 + 2;
          local_a8._M_allocated_capacity = (size_type)(local_d7 + 3);
          local_a8._8_8_ = local_d7;
          local_98._M_p = (pointer)&local_70;
          local_90 = &local_c0;
          local_88._M_allocated_capacity = (size_type)&local_c4;
          aVar5 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_&>
                            (out,specs,sVar15,sVar15,(anon_class_56_7_162c6e41 *)local_b8);
          return (appender)
                 aVar5.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.
                 container;
        }
        goto LAB_001f1678;
      }
      uVar12 = iVar13 - local_c4 & (int)(local_d0._4_4_ << 0xc) >> 0x1f;
      local_d5._1_4_ = uVar12;
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)local_b8,loc,
                 (bool)((byte)((uint)local_d0._4_4_ >> 0x11) & 1));
      iVar13 = 0;
      if ((int)uVar12 < 1) {
        uVar12 = 0;
      }
      sVar15 = (ulong)uVar12 + (uVar9 >> 0x20) + (ulong)bVar16;
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_b8._0_8_;
      do {
        iVar8 = 0x7fffffff;
        if (local_90 != (float_specs *)0x0) {
          if (paVar7 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_b8._0_8_ + (long)(int *)local_b8._8_8_)) {
            uVar12 = (uint)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(local_b8._0_8_ + (long)(int *)local_b8._8_8_))->_M_local_buf[-1];
          }
          else {
            bVar2 = paVar7->_M_local_buf[0];
            if ((byte)(bVar2 + 0x81) < 0x82) goto LAB_001f1531;
            paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(paVar7->_M_local_buf + 1);
            uVar12 = (uint)bVar2;
          }
          iVar13 = iVar13 + uVar12;
          iVar8 = iVar13;
        }
LAB_001f1531:
        sVar15 = sVar15 + 1;
      } while (iVar8 < (int)local_c0._4_4_);
      local_70._M_allocated_capacity = (size_type)(local_d7 + 1);
      local_70._8_8_ = &local_c0;
      local_60._M_allocated_capacity = (size_type)&local_c4;
      local_60._8_8_ = &local_c0.field_0x4;
      local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_d7;
      local_40._M_allocated_capacity = (size_type)(local_d7 + 3);
      local_40._8_8_ = local_d7 + 2;
      local_48 = (digit_grouping<char> *)local_b8;
      bVar4.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_&>
                     (out,specs,sVar15,sVar15,(anon_class_64_8_e6ffa566 *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_p != &local_88) {
        operator_delete(local_98._M_p,(ulong)(local_88._M_allocated_capacity + 1));
      }
      uVar6 = local_a8._M_allocated_capacity;
      uVar11 = local_b8._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_b8 + 0x10)) {
        return (appender)bVar4.container;
      }
    }
    else {
      lVar14 = lVar14 + (ulong)uVar12;
      local_d5._1_4_ = iVar13 - local_c0._4_4_;
      if (((uint)local_d0._4_4_ >> 0x13 & 1) != 0) {
        if (local_d0._4_1_ != '\x02' && (int)local_d5._1_4_ < 1) {
          local_d5._1_4_ = 0;
        }
        lVar14 = lVar14 + 1;
        if (0 < (long)(int)local_d5._1_4_) {
          lVar14 = lVar14 + (int)local_d5._1_4_;
        }
      }
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)&local_70,loc,
                 (bool)((byte)((uint)local_d0._4_4_ >> 0x11) & 1));
      sVar15 = lVar14 - 1;
      iVar13 = 0;
      uVar6 = local_70._0_8_;
      do {
        iVar8 = 0x7fffffff;
        if (local_48 != (digit_grouping<char> *)0x0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_70._8_8_ + local_70._M_allocated_capacity)) {
            uVar12 = (uint)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(local_70._8_8_ + local_70._M_allocated_capacity))->_M_local_buf[-1];
          }
          else {
            bVar2 = *(byte *)uVar6;
            if ((byte)(bVar2 + 0x81) < 0x82) goto LAB_001f13e8;
            uVar6 = uVar6 + 1;
            uVar12 = (uint)bVar2;
          }
          iVar13 = iVar13 + uVar12;
          iVar8 = iVar13;
        }
LAB_001f13e8:
        sVar15 = sVar15 + 1;
      } while (iVar8 < (int)local_c0._4_4_);
      local_b8._0_8_ = local_d7 + 1;
      local_b8._8_8_ = &local_c0;
      local_a8._M_allocated_capacity = (size_type)&local_c4;
      local_90 = (float_specs *)(local_d7 + 7);
      local_88._M_allocated_capacity = (size_type)local_d7;
      local_88._8_8_ = local_d7 + 3;
      local_78 = local_d7 + 2;
      local_a8._8_8_ = f;
      local_98._M_p = (pointer)&local_70;
      bVar4.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_&>
                     (out,specs,sVar15,sVar15,(anon_class_72_9_0c6a3a8a *)local_b8);
      if (local_50 != &local_40) {
        operator_delete(local_50,(ulong)(local_40._M_allocated_capacity + 1));
      }
      uVar6 = local_60._M_allocated_capacity;
      uVar11 = local_70._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._0_8_ == &local_60) {
        return (appender)bVar4.container;
      }
    }
    operator_delete((void *)uVar11,uVar6 + 1);
    return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar4.container;
  }
LAB_001f1678:
  local_d0 = fVar1;
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/fmt/include/fmt/core.h"
              ,0x17a,"negative value");
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}